

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O2

size_t __thiscall VGMPlayer::DeviceID2OptionID(VGMPlayer *this,UINT32 id)

{
  pointer pCVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = 0xffffffffffffffff;
  if ((int)id < 0) {
    uVar2 = id >> 0x10;
  }
  else {
    uVar4 = (ulong)id;
    pCVar1 = (this->_devices).
             super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_devices).
                       super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0xf0) <= uVar4)
    {
      return 0xffffffffffffffff;
    }
    id = (UINT32)pCVar1[uVar4].chipType;
    uVar2 = (uint)pCVar1[uVar4].chipID;
  }
  if ((byte)uVar2 < 2) {
    sVar3 = *(size_t *)
             ((long)this->_devOptMap[0] + (ulong)(uVar2 & 0xff) * 8 + (ulong)((id & 0xff) << 4));
  }
  return sVar3;
}

Assistant:

size_t VGMPlayer::DeviceID2OptionID(UINT32 id) const
{
	UINT8 type;
	UINT8 instance;
	
	if (id & 0x80000000)
	{
		type = (id >> 0) & 0xFF;
		instance = (id >> 16) & 0xFF;
	}
	else if (id < _devices.size())
	{
		type = _devices[id].chipType;
		instance = _devices[id].chipID;
	}
	else
	{
		return (size_t)-1;
	}
	
	if (instance < 2)
		return _devOptMap[type][instance];
	else
		return (size_t)-1;
}